

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siphash.cpp
# Opt level: O2

CSipHasher * __thiscall CSipHasher::Write(CSipHasher *this,Span<const_unsigned_char> data)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  uint64_t uVar7;
  ulong uVar8;
  uint64_t uVar9;
  ulong uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  size_t sVar13;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar11 = this->v[0];
  uVar9 = this->v[1];
  uVar3 = this->v[2];
  uVar7 = this->v[3];
  uVar12 = this->tmp;
  bVar1 = this->count;
  bVar4 = bVar1 * '\b';
  for (sVar13 = 0; data.m_size != sVar13; sVar13 = sVar13 + 1) {
    uVar12 = (ulong)data.m_data[sVar13] << (bVar4 & 0x38) | uVar12;
    if (((bVar1 + 1 & 0xff) + (int)sVar13 & 7) == 0) {
      uVar10 = uVar11 + uVar9;
      uVar8 = (uVar9 << 0xd | uVar9 >> 0x33) ^ uVar10;
      uVar5 = uVar7 ^ uVar12;
      uVar6 = (uVar5 << 0x10 | uVar5 >> 0x30) ^ uVar3 + uVar5;
      uVar10 = (uVar10 << 0x20 | uVar10 >> 0x20) + uVar6;
      uVar3 = uVar3 + uVar5 + uVar8;
      uVar8 = (uVar8 << 0x11 | uVar8 >> 0x2f) ^ uVar3;
      uVar5 = (uVar6 << 0x15 | uVar6 >> 0x2b) ^ uVar10;
      uVar10 = uVar10 + uVar8;
      uVar6 = (uVar8 << 0xd | uVar8 >> 0x33) ^ uVar10;
      uVar3 = (uVar3 << 0x20 | uVar3 >> 0x20) + uVar5;
      uVar5 = (uVar5 << 0x10 | uVar5 >> 0x30) ^ uVar3;
      uVar8 = (uVar10 << 0x20 | uVar10 >> 0x20) + uVar5;
      uVar7 = (uVar5 << 0x15 | uVar5 >> 0x2b) ^ uVar8;
      uVar3 = uVar3 + uVar6;
      uVar9 = (uVar6 << 0x11 | uVar6 >> 0x2f) ^ uVar3;
      uVar3 = uVar3 << 0x20 | uVar3 >> 0x20;
      uVar11 = uVar8 ^ uVar12;
      uVar12 = 0;
    }
    bVar4 = bVar4 + 8;
  }
  this->v[0] = uVar11;
  this->v[1] = uVar9;
  this->v[2] = uVar3;
  this->v[3] = uVar7;
  this->count = bVar1 + (char)data.m_size;
  this->tmp = uVar12;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

CSipHasher& CSipHasher::Write(Span<const unsigned char> data)
{
    uint64_t v0 = v[0], v1 = v[1], v2 = v[2], v3 = v[3];
    uint64_t t = tmp;
    uint8_t c = count;

    while (data.size() > 0) {
        t |= uint64_t{data.front()} << (8 * (c % 8));
        c++;
        if ((c & 7) == 0) {
            v3 ^= t;
            SIPROUND;
            SIPROUND;
            v0 ^= t;
            t = 0;
        }
        data = data.subspan(1);
    }

    v[0] = v0;
    v[1] = v1;
    v[2] = v2;
    v[3] = v3;
    count = c;
    tmp = t;

    return *this;
}